

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_match.h
# Opt level: O0

bool booster::operator>=(string_type *l,
                        sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *r)

{
  int iVar1;
  string *in_RDI;
  byte bVar2;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  string local_30 [48];
  
  sub_match::operator_cast_to_string
            ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  iVar1 = std::__cxx11::string::compare(in_RDI);
  bVar2 = -1 < iVar1;
  std::__cxx11::string::~string(local_30);
  return (bool)(bVar2 & 1);
}

Assistant:

bool operator>=(
		typename sub_match<Iterator>::string_type const &l,
		sub_match<Iterator> const &r) 
	{ return l.compare(r) >= 0; }